

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

void useup(obj *obj)

{
  uint uVar1;
  obj *obj_local;
  
  if (obj->quan < 2) {
    useupall(obj);
  }
  else {
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xff7fffff;
    obj->quan = obj->quan + -1;
    uVar1 = weight(obj);
    obj->owt = uVar1;
    update_inventory();
  }
  return;
}

Assistant:

void useup(struct obj *obj)
{
	/*  Note:  This works correctly for containers because they */
	/*	   (containers) don't merge.			    */
	if (obj->quan > 1L) {
		obj->in_use = FALSE;	/* no longer in use */
		obj->quan--;
		obj->owt = weight(obj);
		update_inventory();
	} else {
		useupall(obj);
	}
}